

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O1

Type * __thiscall LLVMBC::Type::getStructElementType(Type *this,uint index)

{
  if (this->type_id != StructTyID) {
    __assert_fail("type_id == TypeID::StructTyID",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/bc/type.cpp"
                  ,0x9c,"Type *LLVMBC::Type::getStructElementType(unsigned int) const");
  }
  if ((ulong)index < (ulong)(*(long *)&this[1].type_id - (long)this[1].context >> 3)) {
    return (Type *)(&(this[1].context)->current_block)[index];
  }
  __assert_fail("N < member_types.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/bc/type.cpp"
                ,0xbf,"Type *LLVMBC::StructType::getElementType(unsigned int) const");
}

Assistant:

Type *Type::getStructElementType(unsigned index) const
{
	assert(type_id == TypeID::StructTyID);
	return cast<StructType>(this)->getElementType(index);
}